

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O3

set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_> *
__thiscall
CsSignal::SignalBase::internal_receiverList
          (set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_>
           *__return_storage_ptr__,SignalBase *this,BentoAbstract *signalMethod_Bento)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  char cVar3;
  __pointer_type pzVar4;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  long *plVar7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<CsSignal::SlotBase_*>,_bool> pVar9;
  read_handle senderListHandle;
  read_handle local_48;
  SlotBase *local_28;
  __pointer_type pzVar5;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48.m_ptr = &(this->m_connectList).m_obj;
  local_48.m_accessed = false;
  local_48.m_guard.m_list = local_48.m_ptr;
  local_48.m_guard.m_zombie = (zombie_list_node *)operator_new(0x18);
  uVar6 = 0;
  ((local_48.m_guard.m_zombie)->next)._M_b._M_p = (__pointer_type)0x0;
  ((local_48.m_guard.m_zombie)->owner)._M_b._M_p = &local_48.m_guard;
  (local_48.m_guard.m_zombie)->zombie_node = (node *)0x0;
  pzVar5 = *(__pointer_type *)&(this->m_connectList).field_0x10;
  ((local_48.m_guard.m_zombie)->next)._M_b._M_p = pzVar5;
  while( true ) {
    puVar2 = &(this->m_connectList).field_0x10;
    LOCK();
    pzVar4 = *(__pointer_type *)puVar2;
    bVar8 = pzVar5 == pzVar4;
    if (bVar8) {
      *(zombie_list_node **)puVar2 = local_48.m_guard.m_zombie;
      pzVar4 = pzVar5;
    }
    UNLOCK();
    if (bVar8) break;
    ((local_48.m_guard.m_zombie)->next)._M_b._M_p = pzVar4;
    pzVar5 = pzVar4;
  }
  local_48.m_accessed = true;
  plVar7 = *(long **)local_48.m_ptr;
  if (plVar7 != (long *)0x0) {
    do {
      cVar3 = (**(code **)(*(long *)plVar7[3] + 0x10))((long *)plVar7[3],signalMethod_Bento,uVar6);
      uVar6 = extraout_RDX;
      if (cVar3 != '\0') {
        local_28 = (SlotBase *)plVar7[4];
        pVar9 = std::
                _Rb_tree<CsSignal::SlotBase*,CsSignal::SlotBase*,std::_Identity<CsSignal::SlotBase*>,std::less<CsSignal::SlotBase*>,std::allocator<CsSignal::SlotBase*>>
                ::_M_insert_unique<CsSignal::SlotBase*>
                          ((_Rb_tree<CsSignal::SlotBase*,CsSignal::SlotBase*,std::_Identity<CsSignal::SlotBase*>,std::less<CsSignal::SlotBase*>,std::allocator<CsSignal::SlotBase*>>
                            *)__return_storage_ptr__,&local_28);
        uVar6 = pVar9._8_8_;
      }
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  libguarded::
  rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
  ::read_handle::~read_handle(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::set<CsSignal::SlotBase *> CsSignal::SignalBase::internal_receiverList(
                  const Internal::BentoAbstract &signalMethod_Bento) const
{
   std::set<SlotBase *> retval;

   auto senderListHandle = m_connectList.lock_read();

   for (auto &item : *senderListHandle) {

      if (*(item.signalMethod) != signalMethod_Bento)  {
         continue;
      }

      retval.insert(const_cast<SlotBase *>(item.receiver));
   }

   return retval;
}